

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  char *__function;
  ImGuiContext *g;
  float fVar7;
  
  pIVar4 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  if ((pIVar6->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    EndColumns();
  }
  PopClipRect();
  if ((pIVar6->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  iVar2 = (pIVar4->CurrentWindowStack).Size;
  if (0 < iVar2) {
    uVar1 = iVar2 - 1;
    (pIVar4->CurrentWindowStack).Size = uVar1;
    if ((pIVar6->Flags & 0x4000000) != 0) {
      iVar3 = (pIVar4->CurrentPopupStack).Size;
      if (iVar3 < 1) {
        __function = "void ImVector<ImGuiPopupRef>::pop_back() [T = ImGuiPopupRef]";
        goto LAB_00153bb3;
      }
      (pIVar4->CurrentPopupStack).Size = iVar3 + -1;
    }
    pIVar5 = GImGui;
    if ((pIVar6->DC).StackSizesBackup[0] != (pIVar6->IDStack).Size) {
      __assert_fail("*p_backup == current && \"PushID/PopID or TreeNode/TreePop Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x147a,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar6->DC).StackSizesBackup[1] != (pIVar6->DC).GroupStack.Size) {
      __assert_fail("*p_backup == current && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x147b,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar6->DC).StackSizesBackup[2] != (GImGui->CurrentPopupStack).Size) {
      __assert_fail("*p_backup == current && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x147c,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((GImGui->ColorModifiers).Size <= (pIVar6->DC).StackSizesBackup[3]) {
      if ((pIVar6->DC).StackSizesBackup[4] < (GImGui->StyleModifiers).Size) {
        __assert_fail("*p_backup >= current && \"PushStyleVar/PopStyleVar Mismatch!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0x147f,"void CheckStacksSize(ImGuiWindow *, bool)");
      }
      if ((GImGui->FontStack).Size <= (pIVar6->DC).StackSizesBackup[5]) {
        if (uVar1 == 0) {
          pIVar6 = (ImGuiWindow *)0x0;
        }
        else {
          if (iVar2 == 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                          ,0x4a4,"value_type &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
          }
          pIVar6 = (pIVar4->CurrentWindowStack).Data[(ulong)uVar1 - 1];
        }
        GImGui->CurrentWindow = pIVar6;
        if (pIVar6 != (ImGuiWindow *)0x0) {
          fVar7 = pIVar5->FontBaseSize * pIVar6->FontWindowScale;
          (pIVar5->DrawListSharedData).FontSize = fVar7;
          pIVar5->FontSize = fVar7;
        }
        return;
      }
      __assert_fail("*p_backup >= current && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x1480,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    __assert_fail("*p_backup >= current && \"PushStyleColor/PopStyleColor Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x147e,"void CheckStacksSize(ImGuiWindow *, bool)");
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_00153bb3:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                ,0x4b9,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.CurrentPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}